

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O1

void __thiscall QSettings::endGroup(QSettings *this)

{
  QObjectData *pQVar1;
  int *piVar2;
  ulong uVar3;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length;
  long in_FS_OFFSET;
  QMessageLogger local_68;
  value_type local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (pQVar1[2].children.d.ptr == (QObject **)0x0) {
    endGroup();
  }
  else {
    local_48.str.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.str.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.str.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.num = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.maxNum = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QSettingsGroup>::takeLast(&local_48,(QList<QSettingsGroup> *)&pQVar1[2].parent);
    QSettingsGroup::toString((QString *)&local_68,&local_48);
    piVar2 = (int *)CONCAT44(local_68.context.line,local_68.context.version);
    uVar3 = CONCAT44(local_68.context.function._4_4_,local_68.context.function._0_4_);
    __length = extraout_RDX;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_68.context.line,local_68.context.version),2,0x10);
        __length = extraout_RDX_00;
      }
    }
    if (uVar3 != 0) {
      QString::truncate((QString *)&pQVar1[2].children.d.size,
                        (char *)((long)&(pQVar1[2].metaObject)->_vptr_QDynamicMetaObjectData +
                                ~uVar3),__length);
    }
    if ((undefined1 *)local_48.num != (undefined1 *)0xffffffffffffffff) {
      local_68.context.version = 2;
      local_68.context.line = 0;
      local_68.context.file._0_4_ = 0;
      local_68.context.file._4_4_ = 0;
      local_68.context.function._0_4_ = 0;
      local_68.context.function._4_4_ = 0;
      local_68.context.category = "default";
      QMessageLogger::warning(&local_68,"QSettings::endGroup: Expected endArray() instead");
    }
    if (&(local_48.str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.str.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSettings::endGroup()
{
    Q_D(QSettings);
    if (d->groupStack.isEmpty()) {
        qWarning("QSettings::endGroup: No matching beginGroup()");
        return;
    }

    QSettingsGroup group = d->groupStack.pop();
    qsizetype len = group.toString().size();
    if (len > 0)
        d->groupPrefix.truncate(d->groupPrefix.size() - (len + 1));

    if (group.isArray())
        qWarning("QSettings::endGroup: Expected endArray() instead");
}